

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftmgr.c
# Opt level: O1

void ftmgr_fill(ftmgr *ftmgr)

{
  __ftb *p_Var1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  ssize_t sVar5;
  
  if (ftmgr->fd != -1) {
    while (bVar2 = ftmgr->bitmap, bVar2 != 0) {
      uVar4 = 0;
      if (bVar2 != 0) {
        for (; (bVar2 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      sVar5 = read(ftmgr->fd,ftmgr->ftq[uVar4].blk + 4,0x1f7);
      if ((int)sVar5 < 1) {
        close(ftmgr->fd);
        ftmgr->fd = -1;
        return;
      }
      bVar2 = (byte)uVar4 & 7;
      ftmgr->bitmap = ftmgr->bitmap & (-2 << bVar2 | 0xfeU >> 8 - bVar2);
      p_Var1 = ftmgr->ftq + uVar4;
      *(uint32_t *)p_Var1->blk = ftmgr->offset;
      ftmgr->offset = ftmgr->offset + (int)sVar5;
      p_Var1->size = (short)sVar5 + 4;
      cVar3 = ftmgr->tts;
      ftmgr->tts = cVar3 + '\x01';
      p_Var1->tts = cVar3;
    }
  }
  return;
}

Assistant:

void ftmgr_fill(struct ftmgr *ftmgr)
{
    if(ftmgr->fd == -1)
        return;
    while(ftmgr->bitmap) {
        int rn;
        uint8_t seq;
        seq = ffs(ftmgr->bitmap) - 1;

        rn =read(ftmgr->fd, ftmgr->ftq[seq].blk + BLK_HDR_SIZE, BLK_MTU - BLK_HDR_SIZE);
        if(rn <= 0) {
            close(ftmgr->fd);
            ftmgr->fd = -1;
            break;
        }

        ftmgr->bitmap &= ~(1 << seq);
        U32_TO_STREAM(ftmgr->ftq[seq].blk, ftmgr->offset);
        ftmgr->offset += rn;
        ftmgr->ftq[seq].size = rn + BLK_HDR_SIZE;
        ftmgr->ftq[seq].tts = ftmgr->tts++;
    }
}